

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

void gravity_function_array_serialize(gravity_function_t *f,json_t *json,gravity_value_r r)

{
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 *paVar1;
  bool bVar2;
  gravity_value_t v;
  
  if (f->tag == EXEC_TYPE_NATIVE) {
    paVar1 = &(r.p)->field_1;
    while (bVar2 = r.n != 0, r.n = r.n - 1, bVar2) {
      v.field_1.n = paVar1->n;
      v.isa = (gravity_class_t *)paVar1[-1].n;
      gravity_value_serialize((char *)0x0,v,json);
      paVar1 = paVar1 + 2;
    }
    return;
  }
  __assert_fail("f->tag == EXEC_TYPE_NATIVE",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                ,0x23a,
                "void gravity_function_array_serialize(gravity_function_t *, json_t *, gravity_value_r)"
               );
}

Assistant:

static void gravity_function_array_serialize (gravity_function_t *f, json_t *json, gravity_value_r r) {
    assert(f->tag == EXEC_TYPE_NATIVE);
    size_t n = marray_size(r);

    for (size_t i=0; i<n; i++) {
        gravity_value_t v = marray_get(r, i);
        gravity_value_serialize(NULL, v, json);
    }
}